

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O2

regex_stack_entry * __thiscall CRegexStack::get_frame(CRegexStack *this,int depth)

{
  int *piVar1;
  regex_stack_entry *prVar2;
  bool bVar3;
  
  prVar2 = (regex_stack_entry *)(this->buf_ + this->sp_);
  while ((bVar3 = depth != 0, depth = depth + -1, bVar3 && (prVar2 != (regex_stack_entry *)0x0))) {
    piVar1 = &prVar2->prv_sp;
    prVar2 = (regex_stack_entry *)(this->buf_ + *piVar1);
    if ((long)*piVar1 < 0) {
      prVar2 = (regex_stack_entry *)0x0;
    }
  }
  return prVar2;
}

Assistant:

regex_stack_entry *get_frame(int depth)
    {
        /* traverse the given number of frames from the top of the stack */
        regex_stack_entry *fp;
        for (fp = (regex_stack_entry *)(buf_ + sp_) ;
             depth != 0 && fp != 0 ; --depth, fp = get_parent_frame(fp)) ;

        /* return the frame pointer */
        return fp;
    }